

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::udiv(SVInt *this,SVInt *lhs,SVInt *rhs,bool bothSigned)

{
  logic_t lVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  ulong value;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  uint rhsWords;
  uint32_t lhsWords;
  SVInt SVar5;
  
  bVar2 = (lhs->super_SVIntStorage).bitWidth;
  if ((bVar2 < 0x41) && (((lhs->super_SVIntStorage).unknownFlag & 1U) == 0)) {
    value = (lhs->super_SVIntStorage).field_0.val / (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    bVar2 = getActiveBits(lhs);
    bVar3 = getActiveBits(rhs);
    rhsWords = 0;
    if (bVar3 != 0) {
      rhsWords = (bVar3 - 1 >> 6) + 1;
    }
    if (bVar2 == 0) {
LAB_0018b767:
      bVar2 = (lhs->super_SVIntStorage).bitWidth;
      value = 0;
    }
    else if (lhs == rhs) {
      bVar2 = (lhs->super_SVIntStorage).bitWidth;
      value = 1;
    }
    else {
      lhsWords = (bVar2 - 1 >> 6) + 1;
      lVar1 = operator<(lhs,rhs);
      if ((lhsWords < rhsWords) ||
         (((lVar1.value != '\0' && (lVar1.value != '@')) && (lVar1.value != 0x80))))
      goto LAB_0018b767;
      if (rhsWords != 1 || 0x40 < bVar2) {
        (this->super_SVIntStorage).field_0.val = 0;
        (this->super_SVIntStorage).bitWidth = 1;
        (this->super_SVIntStorage).signFlag = false;
        (this->super_SVIntStorage).unknownFlag = false;
        divide(lhs,lhsWords,rhs,rhsWords,this,(SVInt *)0x0);
        uVar4 = extraout_RDX_00;
        goto LAB_0018b78b;
      }
      bVar2 = (lhs->super_SVIntStorage).bitWidth;
      value = *(lhs->super_SVIntStorage).field_0.pVal / *(rhs->super_SVIntStorage).field_0.pVal;
    }
  }
  SVInt(this,bVar2,value,bothSigned);
  uVar4 = extraout_RDX;
LAB_0018b78b:
  SVar5.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar5.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar5.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar5.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar5.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar5.super_SVIntStorage;
}

Assistant:

SVInt SVInt::udiv(const SVInt& lhs, const SVInt& rhs, bool bothSigned) {
    // At this point we have two values with the same bit widths, both positive,
    // and X's have been dealt with. Also, we know rhs isn't zero.
    if (lhs.isSingleWord())
        return SVInt(lhs.bitWidth, lhs.val / rhs.val, bothSigned);

    bitwidth_t lhsBits = lhs.getActiveBits();
    uint32_t lhsWords = !lhsBits ? 0 : (whichWord(lhsBits - 1) + 1);
    bitwidth_t rhsBits = rhs.getActiveBits();
    uint32_t rhsWords = !rhsBits ? 0 : (whichWord(rhsBits - 1) + 1);

    // 0 / X
    if (!lhsWords)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X / X
    if (&lhs == &rhs)
        return SVInt(lhs.bitWidth, 1, bothSigned);
    // X / Y where X < Y
    if (lhsWords < rhsWords || lhs < rhs)
        return SVInt(lhs.bitWidth, 0, bothSigned);
    // X and Y are actually a single word
    if (lhsWords == 1 && rhsWords == 1)
        return SVInt(lhs.bitWidth, lhs.pVal[0] / rhs.pVal[0], bothSigned);

    // compute it the hard way with the Knuth algorithm
    SVInt quotient;
    divide(lhs, lhsWords, rhs, rhsWords, &quotient, nullptr);
    return quotient;
}